

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.h
# Opt level: O3

void __thiscall
slang::ast::DistExpression::visitExprs<slang::ast::SampledValueExprVisitor&>
          (DistExpression *this,SampledValueExprVisitor *visitor)

{
  size_type sVar1;
  pointer pDVar2;
  pointer pDVar3;
  Expression **ppEVar4;
  
  Expression::visitExpression<slang::ast::Expression_const,slang::ast::SampledValueExprVisitor&>
            (this->left_,this->left_,visitor);
  sVar1 = (this->items_).size_;
  if (sVar1 != 0) {
    pDVar2 = (this->items_).data_;
    ppEVar4 = &(pDVar2->weight).
               super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
               _M_value.expr;
    do {
      Expression::visitExpression<slang::ast::Expression_const,slang::ast::SampledValueExprVisitor&>
                (ppEVar4[-2],ppEVar4[-2],visitor);
      if (*(char *)(ppEVar4 + 1) == '\x01') {
        Expression::
        visitExpression<slang::ast::Expression_const,slang::ast::SampledValueExprVisitor&>
                  (*ppEVar4,*ppEVar4,visitor);
      }
      pDVar3 = (pointer)(ppEVar4 + 2);
      ppEVar4 = ppEVar4 + 4;
    } while (pDVar3 != pDVar2 + sVar1);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        left().visit(visitor);
        for (auto& item : items_) {
            item.value.visit(visitor);
            if (item.weight)
                item.weight->expr.visit(visitor);
        }
    }